

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O2

void llvm::APInt::tcExtract(WordType *dst,uint dstCount,WordType *src,uint srcBits,uint srcLSB)

{
  WordType WVar1;
  uint uVar2;
  uint parts;
  ulong uVar3;
  
  parts = srcBits + 0x3f >> 6;
  uVar3 = (ulong)parts;
  if (parts <= dstCount) {
    tcAssign(dst,src + (srcLSB >> 6),parts);
    tcShiftRight(dst,parts,srcLSB & 0x3f);
    uVar2 = (srcBits + 0x3f & 0xffffffc0) - (srcLSB & 0x3f);
    if (srcBits < uVar2 || srcBits - uVar2 == 0) {
      if ((srcBits < uVar2) && ((srcBits & 0x3f) != 0)) {
        WVar1 = lowBitMask(srcBits & 0x3f);
        dst[parts - 1] = dst[parts - 1] & WVar1;
      }
    }
    else {
      WVar1 = lowBitMask(srcBits - uVar2);
      dst[parts - 1] = dst[parts - 1] | (WVar1 & src[(srcLSB >> 6) + parts]) << ((byte)uVar2 & 0x3f)
      ;
    }
    for (; uVar3 < dstCount; uVar3 = uVar3 + 1) {
      dst[uVar3] = 0;
    }
    return;
  }
  __assert_fail("dstParts <= dstCount",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                ,0x8dd,
                "static void llvm::APInt::tcExtract(WordType *, unsigned int, const WordType *, unsigned int, unsigned int)"
               );
}

Assistant:

void
APInt::tcExtract(WordType *dst, unsigned dstCount, const WordType *src,
                 unsigned srcBits, unsigned srcLSB) {
  unsigned dstParts = (srcBits + APINT_BITS_PER_WORD - 1) / APINT_BITS_PER_WORD;
  assert(dstParts <= dstCount);

  unsigned firstSrcPart = srcLSB / APINT_BITS_PER_WORD;
  tcAssign (dst, src + firstSrcPart, dstParts);

  unsigned shift = srcLSB % APINT_BITS_PER_WORD;
  tcShiftRight (dst, dstParts, shift);

  /* We now have (dstParts * APINT_BITS_PER_WORD - shift) bits from SRC
     in DST.  If this is less that srcBits, append the rest, else
     clear the high bits.  */
  unsigned n = dstParts * APINT_BITS_PER_WORD - shift;
  if (n < srcBits) {
    WordType mask = lowBitMask (srcBits - n);
    dst[dstParts - 1] |= ((src[firstSrcPart + dstParts] & mask)
                          << n % APINT_BITS_PER_WORD);
  } else if (n > srcBits) {
    if (srcBits % APINT_BITS_PER_WORD)
      dst[dstParts - 1] &= lowBitMask (srcBits % APINT_BITS_PER_WORD);
  }

  /* Clear high parts.  */
  while (dstParts < dstCount)
    dst[dstParts++] = 0;
}